

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder2.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  CountingMazeBuilder local_28 [8];
  CountingMazeBuilder builder;
  MazeGame local_18;
  MazeGame game;
  int doors;
  int rooms;
  
  MazeGame::MazeGame(&local_18);
  CountingMazeBuilder::CountingMazeBuilder(local_28);
  MazeGame::CreateMaze((MazeBuilder *)&local_18);
  CountingMazeBuilder::GetCounts((int *)local_28,(int *)((long)&game._vptr_MazeGame + 4));
  poVar1 = std::operator<<((ostream *)&std::cout,"The maze has ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,game._vptr_MazeGame._4_4_);
  poVar1 = std::operator<<(poVar1," rooms and ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)game._vptr_MazeGame);
  poVar1 = std::operator<<(poVar1," doors");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main()
{
  int rooms, doors;
  MazeGame game;
  CountingMazeBuilder builder;
  
  game.CreateMaze(builder);
  builder.GetCounts(rooms, doors);
  
  cout << "The maze has "
       << rooms << " rooms and "
       << doors << " doors" << endl;
}